

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,String *other)

{
  String *other_00;
  String local_48;
  String *local_20;
  String *other_local;
  String *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  String(&local_48,this);
  other_00 = append(&local_48,local_20);
  String(__return_storage_ptr__,other_00);
  ~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& other) const {return String(*this).append(other);}